

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsGFkSolve.cpp
# Opt level: O2

int __thiscall HighsGFkSolve::link(HighsGFkSolve *this,char *__from,char *__to)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  int *piVar4;
  pointer piVar5;
  long lVar6;
  int *piVar7;
  int iVar8;
  int iVar9;
  int *piVar10;
  pointer piVar11;
  HighsInt y;
  long lVar12;
  pointer piVar13;
  int iVar14;
  int local_40;
  int local_3c;
  pointer local_38;
  HighsInt Nleft;
  
  iVar9 = (int)__from;
  piVar5 = (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar3 = (this->colhead).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar11 = (this->Anext).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  piVar11[iVar9] = piVar3[piVar5[iVar9]];
  piVar13 = (this->Aprev).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  piVar13[iVar9] = -1;
  piVar3[piVar5[iVar9]] = iVar9;
  lVar6 = (long)piVar11[iVar9];
  if (lVar6 != -1) {
    piVar13[lVar6] = iVar9;
  }
  piVar10 = (this->colsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start + piVar5[iVar9];
  *piVar10 = *piVar10 + 1;
  local_38 = (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
  piVar3 = (this->rowroot).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar1 = local_38[iVar9];
  iVar8 = piVar3[iVar1];
  if (iVar8 != -1) {
    iVar14 = piVar5[iVar9];
    piVar10 = &local_3c;
    local_3c = -1;
    piVar7 = &local_40;
    local_40 = -1;
    piVar13 = (this->ARleft).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar11 = (this->ARright).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      lVar6 = (long)iVar8;
      if (iVar14 < piVar5[lVar6]) {
        iVar2 = piVar13[lVar6];
        lVar12 = (long)iVar2;
        if (lVar12 == -1) {
          piVar11 = (this->ARright).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          iVar14 = -1;
          goto LAB_002ad43f;
        }
        if (iVar14 < piVar5[lVar12]) {
          piVar13[lVar6] = piVar11[lVar12];
          piVar11[lVar12] = iVar8;
          lVar6 = lVar12;
          iVar8 = iVar2;
          if (piVar13[lVar12] == -1) goto LAB_002ad420;
        }
        *piVar10 = iVar8;
        piVar4 = piVar13 + lVar6;
        piVar10 = piVar4;
      }
      else {
        if (iVar14 <= piVar5[lVar6]) goto LAB_002ad420;
        iVar2 = piVar11[lVar6];
        lVar12 = (long)iVar2;
        if (lVar12 == -1) goto LAB_002ad420;
        if (piVar5[lVar12] < iVar14) {
          piVar11[lVar6] = piVar13[lVar12];
          piVar13[lVar12] = iVar8;
          lVar6 = lVar12;
          iVar8 = iVar2;
          if (piVar11[lVar12] == -1) goto LAB_002ad420;
        }
        *piVar7 = iVar8;
        piVar4 = piVar11 + lVar6;
        piVar7 = piVar4;
      }
      iVar8 = *piVar4;
    } while( true );
  }
  (this->ARleft).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start[iVar9] = -1;
  piVar5 = (this->ARright).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start + iVar9;
LAB_002ad4aa:
  *piVar5 = -1;
  piVar3[iVar1] = iVar9;
  iVar9 = local_38[iVar9];
  piVar10 = (this->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start + iVar9;
  *piVar10 = *piVar10 + 1;
  return iVar9;
LAB_002ad420:
  piVar13 = (this->ARleft).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  iVar14 = piVar13[lVar6];
LAB_002ad43f:
  *piVar7 = iVar14;
  *piVar10 = piVar11[lVar6];
  piVar13[lVar6] = local_40;
  piVar11[lVar6] = local_3c;
  piVar3[iVar1] = iVar8;
  if (piVar5[iVar9] < piVar5[lVar6]) {
    piVar5 = (this->ARleft).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar5[iVar9] = piVar5[lVar6];
    iVar8 = piVar3[iVar1];
    piVar11 = (this->ARright).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  else {
    piVar5 = (this->ARright).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar5[iVar9] = piVar5[lVar6];
    iVar8 = piVar3[iVar1];
    piVar11 = (this->ARleft).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  piVar11[iVar9] = iVar8;
  piVar5 = piVar5 + iVar8;
  goto LAB_002ad4aa;
}

Assistant:

void HighsGFkSolve::link(HighsInt pos) {
  Anext[pos] = colhead[Acol[pos]];
  Aprev[pos] = -1;
  colhead[Acol[pos]] = pos;
  if (Anext[pos] != -1) Aprev[Anext[pos]] = pos;

  ++colsize[Acol[pos]];

  auto get_row_left = [&](HighsInt pos) -> HighsInt& { return ARleft[pos]; };
  auto get_row_right = [&](HighsInt pos) -> HighsInt& { return ARright[pos]; };
  auto get_row_key = [&](HighsInt pos) { return Acol[pos]; };
  highs_splay_link(pos, rowroot[Arow[pos]], get_row_left, get_row_right,
                   get_row_key);
  ++rowsize[Arow[pos]];
}